

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_leaf.hpp
# Opt level: O2

bool __thiscall
duckdb::BaseLeaf<(unsigned_char)'\x0f',_(duckdb::NType)9>::HasByte
          (BaseLeaf<(unsigned_char)__x0f_,_(duckdb::NType)9> *this,uint8_t *byte)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = 0;
  do {
    uVar2 = uVar1;
    if (this->count == uVar2) break;
    uVar1 = uVar2 + 1;
  } while (this->key[uVar2] != *byte);
  return uVar2 < this->count;
}

Assistant:

bool HasByte(uint8_t &byte) const {
		for (uint8_t i = 0; i < count; i++) {
			if (key[i] == byte) {
				return true;
			}
		}
		return false;
	}